

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<long,_toml::error_info> * toml::read_dec_int<long>(string *str,source_location *src)

{
  byte bVar1;
  success<long> s;
  string *in_RSI;
  source_location *in_RDI;
  istringstream iss;
  long val;
  int max_digits;
  failure_type *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  source_location *this;
  undefined7 in_stack_fffffffffffffc68;
  source_location *this_00;
  int in_stack_fffffffffffffcac;
  error_info *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffe18;
  source_location *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  istringstream local_1a8 [384];
  long local_28;
  undefined4 local_1c;
  
  local_1c = 0x3f;
  local_28 = 0;
  this_00 = in_RDI;
  std::__cxx11::istringstream::istringstream(local_1a8,in_RSI,_S_in);
  std::istream::operator>>(local_1a8,&local_28);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    s = ok<long&>((long *)in_stack_fffffffffffffc58);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)in_RDI,(success_type)s.value);
  }
  else {
    std::__cxx11::to_string(in_stack_fffffffffffffcac);
    std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffc68),in_stack_fffffffffffffc60);
    source_location::source_location(this_00,in_RDI);
    std::__cxx11::to_string(in_stack_fffffffffffffcac);
    std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffc68),in_stack_fffffffffffffc60);
    make_error_info<>(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    this = (source_location *)&stack0xfffffffffffffdf0;
    err<toml::error_info>(in_stack_fffffffffffffcb8);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)this,in_stack_fffffffffffffc58);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x75c1b2);
    error_info::~error_info((error_info *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    source_location::~source_location(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return (result<long,_toml::error_info> *)this_00;
}

Assistant:

result<T, error_info>
read_dec_int(const std::string& str, const source_location src)
{
    constexpr auto max_digits = std::numeric_limits<T>::digits;
    assert( ! str.empty());

    T val{0};
    std::istringstream iss(str);
    iss >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_dec_integer: "
            "too large integer: current max digits = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}